

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cc
# Opt level: O0

void print_buffer(Pl_Buffer *bp)

{
  uchar *puVar1;
  ostream *poVar2;
  int in_R8D;
  char *local_78;
  string local_50;
  ulong local_30;
  unsigned_long i;
  size_t l;
  uchar *p;
  Buffer *b;
  Pl_Buffer *bp_local;
  
  b = (Buffer *)bp;
  (*(bp->super_Pipeline)._vptr_Pipeline[3])();
  p = (uchar *)Pl_Buffer::getBuffer((Pl_Buffer *)b);
  l = (size_t)Buffer::getBuffer((Buffer *)p);
  i = Buffer::getSize((Buffer *)p);
  for (local_30 = 0; local_30 < i; local_30 = local_30 + 1) {
    QUtil::uint_to_string_base_abi_cxx11_
              (&local_50,(QUtil *)(ulong)*(byte *)(l + local_30),0x10,2,in_R8D);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
    if (local_30 == i - 1) {
      local_78 = "\n";
    }
    else {
      local_78 = " ";
    }
    std::operator<<(poVar2,local_78);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  puVar1 = p;
  if (p != (uchar *)0x0) {
    Buffer::~Buffer((Buffer *)p);
    operator_delete(puVar1,8);
  }
  return;
}

Assistant:

static void
print_buffer(Pl_Buffer* bp)
{
    bp->finish();
    Buffer* b = bp->getBuffer();
    unsigned char const* p = b->getBuffer();
    size_t l = b->getSize();
    for (unsigned long i = 0; i < l; ++i) {
        std::cout << QUtil::uint_to_string_base(p[i], 16, 2) << ((i == l - 1) ? "\n" : " ");
    }
    std::cout << std::endl;
    delete b;
}